

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O0

void __thiscall amrex::STLtools::prepare(STLtools *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  longdouble x;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  bool bVar4;
  int iVar5;
  iterator pTVar6;
  iterator pTVar7;
  iterator pTVar8;
  type_conflict1 *ptVar9;
  double *pdVar10;
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_> *in_RDI;
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_> *this_00;
  Real RVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  int num_isects;
  XDim3 ptref;
  Real Leps;
  Real Lm;
  Real Lp;
  Real eps;
  Real Lz;
  Real Ly;
  Real Lx;
  Real tmp;
  XDim3 norm;
  XDim3 vec2;
  XDim3 vec1;
  Triangle *tri;
  int is_ref_positive;
  XDim3 cent0;
  Type *hv;
  ReduceData<double,_double,_double,_double,_double,_double> reduce_data;
  ReduceOps<amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMax,_amrex::ReduceOpMax,_amrex::ReduceOpMax>
  reduce_op;
  XDim3 *tri_norm;
  Triangle *tri_pts;
  XDim3 *in_stack_fffffffffffffb38;
  undefined8 uVar12;
  undefined2 in_stack_fffffffffffffb40;
  undefined2 uVar13;
  undefined2 in_stack_fffffffffffffb42;
  int in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>
  *in_stack_fffffffffffffb50;
  ostream *in_stack_fffffffffffffb68;
  Print *in_stack_fffffffffffffb70;
  ReduceOps<amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMax,_amrex::ReduceOpMax,_amrex::ReduceOpMax>
  *in_stack_fffffffffffffb98;
  ReduceData<double,_double,_double,_double,_double,_double> *in_stack_fffffffffffffba0;
  Print *in_stack_fffffffffffffbb0;
  anon_class_8_1_442a093b *in_stack_fffffffffffffbd8;
  ReduceData<double,_double,_double,_double,_double,_double> *in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  ReduceOps<amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMax,_amrex::ReduceOpMax,_amrex::ReduceOpMax>
  *in_stack_fffffffffffffbf0;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double *local_348;
  undefined8 local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double *local_318;
  undefined8 local_310;
  double local_308 [3];
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double adStack_288 [2];
  Triangle *local_278;
  uint local_26c;
  double local_268;
  double dStack_260;
  double local_258;
  undefined1 local_c0 [48];
  undefined1 *local_90;
  Triangle *local_78;
  Triangle *local_30;
  XDim3 *local_28;
  XDim3 *local_20;
  Triangle *local_18;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  ParallelDescriptor::Bcast<int>((int *)(in_RDI + 3),1,0);
  bVar4 = ParallelDescriptor::IOProcessor();
  if (!bVar4) {
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (in_stack_fffffffffffffb50,
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  }
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
            (in_stack_fffffffffffffb50,CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
            );
  PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_>::resize
            ((PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_> *)in_stack_fffffffffffffb50,
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  pTVar6 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::begin
                     (in_RDI);
  pTVar7 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::end
                     (in_RDI);
  pTVar8 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::begin
                     (in_RDI + 1);
  Gpu::copyAsync<amrex::STLtools::Triangle*,amrex::STLtools::Triangle*>(pTVar6,pTVar7,pTVar8);
  local_18 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::data
                       (in_RDI + 1);
  local_28 = PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_>::data
                       ((PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_> *)(in_RDI + 2));
  local_30 = local_18;
  local_20 = local_28;
  ParallelFor<int,amrex::STLtools::prepare()::__0,void>
            (in_stack_fffffffffffffb44,(anon_class_16_2_2478c64c *)in_stack_fffffffffffffb38);
  ReduceData<double,double,double,double,double,double>::
  ReduceData<amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMax,amrex::ReduceOpMax,amrex::ReduceOpMax>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_78 = local_18;
  ReduceOps<amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMax,amrex::ReduceOpMax,amrex::ReduceOpMax>
  ::
  eval<int,amrex::ReduceData<double,double,double,double,double,double>,amrex::STLtools::prepare()::__1,void>
            (in_stack_fffffffffffffbf0,iVar5,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  ReduceData<double,double,double,double,double,double>::
  value<amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMax,amrex::ReduceOpMax,amrex::ReduceOpMax>
            ((ReduceData<double,_double,_double,_double,_double,_double> *)
             CONCAT44(in_stack_fffffffffffffb44,
                      CONCAT22(in_stack_fffffffffffffb42,in_stack_fffffffffffffb40)),
             (ReduceOps<amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMax,_amrex::ReduceOpMax,_amrex::ReduceOpMax>
              *)in_stack_fffffffffffffb38);
  local_90 = local_c0;
  ptVar9 = get<0ul,double,double,double,double,double,double>
                     ((GpuTuple<double,_double,_double,_double,_double,_double> *)0x1659e48);
  in_RDI[3].m_size = (size_type)*ptVar9;
  ptVar9 = get<1ul,double,double,double,double,double,double>
                     ((GpuTuple<double,_double,_double,_double,_double,_double> *)0x1659e69);
  in_RDI[3].m_capacity = (size_type)*ptVar9;
  ptVar9 = get<2ul,double,double,double,double,double,double>
                     ((GpuTuple<double,_double,_double,_double,_double,_double> *)0x1659e8a);
  in_RDI[4].m_data = (pointer)*ptVar9;
  ptVar9 = get<3ul,double,double,double,double,double,double>
                     ((GpuTuple<double,_double,_double,_double,_double,_double> *)0x1659eab);
  in_RDI[4].m_size = (size_type)*ptVar9;
  ptVar9 = get<4ul,double,double,double,double,double,double>
                     ((GpuTuple<double,_double,_double,_double,_double,_double> *)0x1659ecc);
  in_RDI[4].m_capacity = (size_type)*ptVar9;
  ptVar9 = get<5ul,double,double,double,double,double,double>
                     ((GpuTuple<double,_double,_double,_double,_double,_double> *)0x1659eed);
  in_RDI[5].m_data = (pointer)*ptVar9;
  iVar5 = Verbose();
  if (0 < iVar5) {
    OutStream();
    Print::Print(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb44,
                                        CONCAT22(in_stack_fffffffffffffb42,in_stack_fffffffffffffb40
                                                )),(char (*) [10])in_stack_fffffffffffffb38);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb44,
                                        CONCAT22(in_stack_fffffffffffffb42,in_stack_fffffffffffffb40
                                                )),in_stack_fffffffffffffb38);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb44,
                                        CONCAT22(in_stack_fffffffffffffb42,in_stack_fffffffffffffb40
                                                )),(char (*) [7])in_stack_fffffffffffffb38);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb44,
                                        CONCAT22(in_stack_fffffffffffffb42,in_stack_fffffffffffffb40
                                                )),in_stack_fffffffffffffb38);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb44,
                                        CONCAT22(in_stack_fffffffffffffb42,in_stack_fffffffffffffb40
                                                )),
                      (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                       *)in_stack_fffffffffffffb38);
    Print::~Print(in_stack_fffffffffffffbb0);
  }
  this_00 = in_RDI;
  local_278 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::
              operator[](in_RDI,0);
  dVar1 = (local_278->v1).x;
  dVar2 = (local_278->v2).x;
  dVar3 = (local_278->v3).x;
  RVar11 = literals::operator____rt((literals *)this_00,(longdouble)3.0);
  local_290 = (dVar1 + dVar2 + dVar3) / RVar11;
  pdVar10 = adStack_288;
  dVar1 = (local_278->v1).y;
  dVar2 = (local_278->v2).y;
  dVar3 = (local_278->v3).y;
  RVar11 = literals::operator____rt((literals *)this_00,(longdouble)3.0);
  *pdVar10 = (dVar1 + dVar2 + dVar3) / RVar11;
  dVar1 = (local_278->v1).z;
  dVar2 = (local_278->v2).z;
  dVar3 = (local_278->v3).z;
  RVar11 = literals::operator____rt((literals *)this_00,(longdouble)3.0);
  local_258 = (dVar1 + dVar2 + dVar3) / RVar11;
  local_268 = local_290;
  dStack_260 = adStack_288[0];
  local_2a8 = (local_278->v2).x - (local_278->v1).x;
  local_2a0 = (local_278->v2).y - (local_278->v1).y;
  local_298 = (local_278->v2).z - (local_278->v1).z;
  local_2c0 = (local_278->v3).x - (local_278->v2).x;
  local_2b8 = (local_278->v3).y - (local_278->v2).y;
  local_2b0 = (local_278->v3).z - (local_278->v2).z;
  local_2d8 = local_2a0 * local_2b0 - local_298 * local_2b8;
  local_2d0 = local_298 * local_2c0 - local_2a8 * local_2b0;
  local_2c8 = local_2a8 * local_2b8 - local_2a0 * local_2c0;
  x = (longdouble)1;
  uVar12 = SUB108(x,0);
  uVar13 = (undefined2)((unkuint10)x >> 0x40);
  RVar11 = literals::operator____rt((literals *)this_00,x);
  local_2e0 = sqrt(local_2c8 * local_2c8 + local_2d8 * local_2d8 + local_2d0 * local_2d0);
  local_2e0 = RVar11 / local_2e0;
  local_2d8 = local_2e0 * local_2d8;
  local_2d0 = local_2e0 * local_2d0;
  local_2c8 = local_2e0 * local_2c8;
  local_308[1] = 2.220446049250313e-16;
  if (local_2d8 <= 2.220446049250313e-16) {
    if (-2.220446049250313e-16 <= local_2d8) {
      local_2e8 = std::numeric_limits<double>::max();
    }
    else {
      local_2e8 = ((double)in_RDI[3].m_size - local_268) / local_2d8;
    }
  }
  else {
    local_2e8 = ((double)in_RDI[4].m_size - local_268) / local_2d8;
  }
  if (local_2d0 <= 2.220446049250313e-16) {
    if (-2.220446049250313e-16 <= local_2d0) {
      local_2f0 = std::numeric_limits<double>::max();
    }
    else {
      local_2f0 = ((double)in_RDI[3].m_capacity - dStack_260) / local_2d0;
    }
  }
  else {
    local_2f0 = ((double)in_RDI[4].m_capacity - dStack_260) / local_2d0;
  }
  if (local_2c8 <= 2.220446049250313e-16) {
    if (-2.220446049250313e-16 <= local_2c8) {
      local_308[2] = std::numeric_limits<double>::max();
    }
    else {
      local_308[2] = ((double)in_RDI[4].m_data - local_258) / local_2c8;
    }
  }
  else {
    local_308[2] = ((double)in_RDI[5].m_data - local_258) / local_2c8;
  }
  local_330 = local_2e8;
  local_328 = local_2f0;
  local_320 = local_308[2];
  local_318 = &local_330;
  local_310 = 3;
  iVar5 = (int)local_318;
  __l._M_len._0_2_ = uVar13;
  __l._M_array = (iterator)uVar12;
  __l._M_len._2_2_ = in_stack_fffffffffffffb42;
  __l._M_len._4_4_ = in_stack_fffffffffffffb44;
  local_308[0] = std::min<double>(__l);
  if (local_2d8 <= 2.220446049250313e-16) {
    if (-2.220446049250313e-16 <= local_2d8) {
      local_2e8 = std::numeric_limits<double>::lowest();
    }
    else {
      local_2e8 = ((double)in_RDI[4].m_size - local_268) / local_2d8;
    }
  }
  else {
    local_2e8 = ((double)in_RDI[3].m_size - local_268) / local_2d8;
  }
  if (local_2d0 <= 2.220446049250313e-16) {
    if (-2.220446049250313e-16 <= local_2d0) {
      local_2f0 = std::numeric_limits<double>::lowest();
    }
    else {
      local_2f0 = ((double)in_RDI[4].m_capacity - dStack_260) / local_2d0;
    }
  }
  else {
    local_2f0 = ((double)in_RDI[3].m_capacity - dStack_260) / local_2d0;
  }
  if (local_2c8 <= 2.220446049250313e-16) {
    if (-2.220446049250313e-16 <= local_2c8) {
      local_308[2] = std::numeric_limits<double>::lowest();
    }
    else {
      local_308[2] = ((double)in_RDI[5].m_data - local_258) / local_2c8;
    }
  }
  else {
    local_308[2] = ((double)in_RDI[4].m_data - local_258) / local_2c8;
  }
  std::abs(iVar5);
  if (extraout_XMM0_Qa < 1e-05) {
    local_2d8 = (double)((ulong)local_2d8 & 0x8000000000000000 | 0x3ee4f8b588e368f1);
  }
  std::abs(iVar5);
  if (extraout_XMM0_Qa_00 < 1e-05) {
    local_2d0 = (double)((ulong)local_2d0 & 0x8000000000000000 | 0x3ee4f8b588e368f1);
  }
  std::abs(iVar5);
  if (extraout_XMM0_Qa_01 < 1e-05) {
    local_2c8 = (double)((ulong)local_2c8 & 0x8000000000000000 | 0x3ee4f8b588e368f1);
  }
  local_360 = local_2e8;
  local_358 = local_2f0;
  local_350 = local_308[2];
  local_348 = &local_360;
  local_340 = 3;
  __l_00._M_len._0_2_ = uVar13;
  __l_00._M_array = (iterator)uVar12;
  __l_00._M_len._2_2_ = in_stack_fffffffffffffb42;
  __l_00._M_len._4_4_ = in_stack_fffffffffffffb44;
  local_338 = std::max<double>(__l_00);
  local_370 = -local_338;
  pdVar10 = std::max<double>(local_308,&local_370);
  local_368 = *pdVar10 * 0.009;
  if (-local_338 <= local_308[0]) {
    in_RDI[5].m_size = (size_type)((local_338 - local_368) * local_2d8 + local_268);
    in_RDI[5].m_capacity = (size_type)((local_338 - local_368) * local_2d0 + dStack_260);
    in_RDI[6].m_data = (pointer)((local_338 - local_368) * local_2c8 + local_258);
  }
  else {
    in_RDI[5].m_size = (size_type)((local_308[0] + local_368) * local_2d8 + local_268);
    in_RDI[5].m_capacity = (size_type)((local_308[0] + local_368) * local_2d0 + dStack_260);
    in_RDI[6].m_data = (pointer)((local_308[0] + local_368) * local_2c8 + local_258);
  }
  local_26c = (uint)(-local_338 > local_308[0]);
  iVar5 = Reduce::Sum<int,int,amrex::STLtools::prepare()::__2,void>
                    ((int)((ulong)pdVar10 >> 0x20),
                     (anon_class_64_4_1e9ff2f8 *)
                     CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                     in_stack_fffffffffffffb44);
  *(bool *)&in_RDI[6].m_size = iVar5 % 2 == 0;
  ReduceData<double,_double,_double,_double,_double,_double>::~ReduceData
            ((ReduceData<double,_double,_double,_double,_double,_double> *)
             CONCAT44(in_stack_fffffffffffffb44,CONCAT22(in_stack_fffffffffffffb42,uVar13)));
  return;
}

Assistant:

void
STLtools::prepare ()
{
    ParallelDescriptor::Bcast(&m_num_tri, 1);
    if (!ParallelDescriptor::IOProcessor()) {
        m_tri_pts_h.resize(m_num_tri);
    }

    //device vectors
    m_tri_pts_d.resize(m_num_tri);
    m_tri_normals_d.resize(m_num_tri);

    Gpu::copyAsync(Gpu::hostToDevice, m_tri_pts_h.begin(), m_tri_pts_h.end(),
                   m_tri_pts_d.begin());

    Triangle const* tri_pts = m_tri_pts_d.data();
    XDim3* tri_norm = m_tri_normals_d.data();

    // Compute normals in case the STL file does not have valid data for normals
    ParallelFor(m_num_tri, [=] AMREX_GPU_DEVICE (int i) noexcept
    {
        Triangle const& tri = tri_pts[i];
        XDim3 vec1{tri.v2.x-tri.v1.x, tri.v2.y-tri.v1.y, tri.v2.z-tri.v1.z};
        XDim3 vec2{tri.v3.x-tri.v2.x, tri.v3.y-tri.v2.y, tri.v3.z-tri.v2.z};
        XDim3 norm{vec1.y*vec2.z-vec1.z*vec2.y,
                   vec1.z*vec2.x-vec1.x*vec2.z,
                   vec1.x*vec2.y-vec1.y*vec2.x};
        Real tmp = 1._rt / std::sqrt(norm.x*norm.x + norm.y*norm.y + norm.z*norm.z);
        tri_norm[i].x = norm.x * tmp;
        tri_norm[i].y = norm.y * tmp;
        tri_norm[i].z = norm.z * tmp;
    });

    ReduceOps<ReduceOpMin,ReduceOpMin,ReduceOpMin,ReduceOpMax,ReduceOpMax,ReduceOpMax> reduce_op;
    ReduceData<Real,Real,Real,Real,Real,Real> reduce_data(reduce_op);
    using ReduceTuple = typename decltype(reduce_data)::Type;
    reduce_op.eval(m_num_tri, reduce_data,
                   [=] AMREX_GPU_DEVICE (int i) -> ReduceTuple
                   {
                       return {amrex::min(tri_pts[i].v1.x,
                                          tri_pts[i].v2.x,
                                          tri_pts[i].v3.x),
                               amrex::min(tri_pts[i].v1.y,
                                          tri_pts[i].v2.y,
                                          tri_pts[i].v3.y),
                               amrex::min(tri_pts[i].v1.z,
                                          tri_pts[i].v2.z,
                                          tri_pts[i].v3.z),
                               amrex::max(tri_pts[i].v1.x,
                                          tri_pts[i].v2.x,
                                          tri_pts[i].v3.x),
                               amrex::max(tri_pts[i].v1.y,
                                          tri_pts[i].v2.y,
                                          tri_pts[i].v3.y),
                               amrex::max(tri_pts[i].v1.z,
                                          tri_pts[i].v2.z,
                                          tri_pts[i].v3.z)};
                   });
    auto const& hv = reduce_data.value(reduce_op);
    m_ptmin.x = amrex::get<0>(hv);
    m_ptmin.y = amrex::get<1>(hv);
    m_ptmin.z = amrex::get<2>(hv);
    m_ptmax.x = amrex::get<3>(hv);
    m_ptmax.y = amrex::get<4>(hv);
    m_ptmax.z = amrex::get<5>(hv);

    if (amrex::Verbose() > 0) {
        amrex::Print() << "    Min: " << m_ptmin << " Max: " << m_ptmax << std::endl;
    }

    // Choose a reference point by extending the normal vector of the first
    // triangle until it's slightly outside the bounding box.
    XDim3 cent0; // centroid of the first triangle
    int is_ref_positive;
    {
        Triangle const& tri = m_tri_pts_h[0];
        cent0 = XDim3{(tri.v1.x + tri.v2.x + tri.v3.x) / 3._rt,
                      (tri.v1.y + tri.v2.y + tri.v3.y) / 3._rt,
                      (tri.v1.z + tri.v2.z + tri.v3.z) / 3._rt};
        // We are computing the normal ourselves in case the stl file does
        // not have valid data on normal.
        XDim3 vec1{tri.v2.x-tri.v1.x, tri.v2.y-tri.v1.y, tri.v2.z-tri.v1.z};
        XDim3 vec2{tri.v3.x-tri.v2.x, tri.v3.y-tri.v2.y, tri.v3.z-tri.v2.z};
        XDim3 norm{vec1.y*vec2.z-vec1.z*vec2.y,
                   vec1.z*vec2.x-vec1.x*vec2.z,
                   vec1.x*vec2.y-vec1.y*vec2.x};
        Real tmp = 1._rt / std::sqrt(norm.x*norm.x + norm.y*norm.y + norm.z*norm.z);
        norm.x *= tmp;
        norm.y *= tmp;
        norm.z *= tmp;
        // Now we need to find out where the normal vector will intersect
        // with the bounding box defined by m_ptmin and m_ptmax.
        Real Lx, Ly, Lz;
        constexpr Real eps = std::numeric_limits<Real>::epsilon();
        if (norm.x > eps) {
            Lx = (m_ptmax.x-cent0.x) / norm.x;
        } else if (norm.x < -eps) {
            Lx = (m_ptmin.x-cent0.x) / norm.x;
        } else {
            Lx = std::numeric_limits<Real>::max();
        }
        if (norm.y > eps) {
            Ly = (m_ptmax.y-cent0.y) / norm.y;
        } else if (norm.y < -eps) {
            Ly = (m_ptmin.y-cent0.y) / norm.y;
        } else {
            Ly = std::numeric_limits<Real>::max();
        }
        if (norm.z > eps) {
            Lz = (m_ptmax.z-cent0.z) / norm.z;
        } else if (norm.z < -eps) {
            Lz = (m_ptmin.z-cent0.z) / norm.z;
        } else {
            Lz = std::numeric_limits<Real>::max();
        }
        Real Lp = std::min({Lx,Ly,Lz});
        if (norm.x > eps) {
            Lx = (m_ptmin.x-cent0.x) / norm.x;
        } else if (norm.x < -eps) {
            Lx = (m_ptmax.x-cent0.x) / norm.x;
        } else {
            Lx = std::numeric_limits<Real>::lowest();
        }
        if (norm.y > eps) {
            Ly = (m_ptmin.y-cent0.y) / norm.y;
        } else if (norm.y < -eps) {
            Ly = (m_ptmax.y-cent0.y) / norm.y;
        } else {
            Ly = std::numeric_limits<Real>::lowest();
        }
        if (norm.z > eps) {
            Lz = (m_ptmin.z-cent0.z) / norm.z;
        } else if (norm.z < -eps) {
            Lz = (m_ptmax.z-cent0.z) / norm.z;
        } else {
            Lz = std::numeric_limits<Real>::lowest();
        }
        if (std::abs(norm.x) < 1.e-5) {
            norm.x = std::copysign(1.e-5, norm.x);
        }
        if (std::abs(norm.y) < 1.e-5) {
            norm.y = std::copysign(1.e-5, norm.y);
        }
        if (std::abs(norm.z) < 1.e-5) {
            norm.z = std::copysign(1.e-5, norm.z);
        }
        Real Lm = std::max({Lx,Ly,Lz});
        Real Leps = std::max(Lp,-Lm) * 0.009;
        if (Lp < -Lm) {
            m_ptref.x = cent0.x + (Lp+Leps) * norm.x;
            m_ptref.y = cent0.y + (Lp+Leps) * norm.y;
            m_ptref.z = cent0.z + (Lp+Leps) * norm.z;
            is_ref_positive = true;
        } else {
            m_ptref.x = cent0.x + (Lm-Leps) * norm.x;
            m_ptref.y = cent0.y + (Lm-Leps) * norm.y;
            m_ptref.z = cent0.z + (Lm-Leps) * norm.z;
            is_ref_positive = false;
        }
    }

    // We now need to figure out if the boundary and the reference is
    // outside or inside the object.
    XDim3 ptref = m_ptref;
    int num_isects = Reduce::Sum<int>(m_num_tri, [=] AMREX_GPU_DEVICE (int i) -> int
        {
            if (i == 0) {
                return 1-is_ref_positive;
            } else {
                Real p1[] = {ptref.x, ptref.y, ptref.z};
                Real p2[] = {cent0.x, cent0.y, cent0.z};
                return static_cast<int>(line_tri_intersects(p1, p2, tri_pts[i]));
            }
        });

    m_boundry_is_outside = num_isects % 2 == 0;
}